

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O2

Symbol * ehf_findsymbol(GlobalVars *gv,Section *sec,char *name)

{
  Symbol *pSVar1;
  int iVar2;
  unsigned_long uVar3;
  Symbol **ppSVar4;
  Symbol *pSVar5;
  
  do {
    ppSVar4 = gv->symbols;
    uVar3 = elf_hash(name);
    pSVar5 = (Symbol *)0x0;
    ppSVar4 = ppSVar4 + (uVar3 & 0xffff);
    while (pSVar1 = *ppSVar4, pSVar1 != (Symbol *)0x0) {
      iVar2 = strcmp(name,pSVar1->name);
      if (iVar2 == 0) {
        if (pSVar5 == (Symbol *)0x0) {
          pSVar5 = pSVar1;
        }
        if (((sec == (Section *)0x0) || (pSVar1->type != '\x02')) ||
           (((pSVar1->relsect->flags ^ sec->flags) & 0x20) == 0)) break;
      }
      ppSVar4 = &pSVar1->glob_chain;
    }
    if (pSVar5 == (Symbol *)0x0) {
      pSVar5 = pSVar1;
    }
    if (pSVar1 != (Symbol *)0x0) {
      pSVar5 = pSVar1;
    }
    if ((pSVar5 == (Symbol *)0x0) || (pSVar5->type != '\x04')) {
      return pSVar5;
    }
    name = pSVar5->indir_name;
  } while( true );
}

Assistant:

static struct Symbol *ehf_findsymbol(struct GlobalVars *gv,
                                     struct Section *sec,const char *name)
{
  struct Symbol *sym = gv->symbols[elf_hash(name)%SYMHTABSIZE];
  struct Symbol *second_choice = NULL;

  while (sym) {
    if (!strcmp(name,sym->name)) {
      if (second_choice == NULL)
        second_choice = sym;

      if (sec!=NULL && sym->type==SYM_RELOC) {
        /* we prefer symbols from a section which has the same CPU-flags
           as the caller's section */
        if ((sec->flags & SF_EHFPPC) == (sym->relsect->flags & SF_EHFPPC))
          break;
      }
      else
        break;
    }
    sym = sym->glob_chain;
  }

  /* accept symbol from a section for a different CPU, if it's the only one */
  if (!sym && second_choice)
    sym = second_choice;

  if (sym)
    if (sym->type == SYM_INDIR)
      return ehf_findsymbol(gv,sec,sym->indir_name);

  return sym;
}